

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-queue-foreach-delete.c
# Opt level: O2

int run_test_queue_foreach_delete(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  uv_idle_t *puVar5;
  uv_prepare_t *puVar6;
  uv_check_t *puVar7;
  uv_fs_event_t *puVar8;
  long lVar9;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar5 = idle;
  uVar2 = uv_default_loop();
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    iVar1 = uv_idle_init(uVar2,puVar5);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
LAB_0016a56e:
      eval_b = 0;
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xb0;
      goto LAB_0016a676;
    }
    iVar1 = uv_idle_start(puVar5,*(undefined8 *)((long)idle_cbs + lVar9));
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) goto LAB_0016a56e;
    puVar5 = puVar5 + 1;
  }
  puVar6 = prepare;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    iVar1 = uv_prepare_init(uVar2,puVar6);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
LAB_0016a5a5:
      eval_b = 0;
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xb1;
      goto LAB_0016a676;
    }
    iVar1 = uv_prepare_start(puVar6,*(undefined8 *)((long)prepare_cbs + lVar9));
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) goto LAB_0016a5a5;
    puVar6 = puVar6 + 1;
  }
  puVar7 = check;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    iVar1 = uv_check_init(uVar2,puVar7);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
LAB_0016a5dc:
      eval_b = 0;
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xb2;
      goto LAB_0016a676;
    }
    iVar1 = uv_check_start(puVar7,*(undefined8 *)((long)check_cbs + lVar9));
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) goto LAB_0016a5dc;
    puVar7 = puVar7 + 1;
  }
  puVar8 = fs_event;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    iVar1 = uv_fs_event_init(uVar2,puVar8);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x8f;
      goto LAB_0016a676;
    }
    iVar1 = uv_fs_event_start(puVar8,*(undefined8 *)((long)fs_event_cbs + lVar9),".");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x95;
      goto LAB_0016a676;
    }
    puVar8 = puVar8 + 1;
  }
  iVar1 = uv_timer_init(uVar2,&timer);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&timer,helper_timer_cb,0,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_run(uVar2,2);
      eval_a = 1;
      eval_b = (int64_t)iVar1;
      if (eval_b == 1) {
        eval_b = (int64_t)idle_cb_calls_0;
        if (eval_b == 1) {
          eval_b = (int64_t)idle_cb_calls_2;
          if (eval_b == 1) {
            eval_b = (int64_t)prepare_cb_calls_0;
            if (eval_b == 1) {
              eval_b = (int64_t)prepare_cb_calls_2;
              if (eval_b == 1) {
                eval_b = (int64_t)check_cb_calls_0;
                if (eval_b == 1) {
                  eval_b = (int64_t)check_cb_calls_2;
                  if (eval_b == 1) {
                    eval_a = 1;
                    eval_b = (int64_t)helper_timer_cb_calls;
                    if (eval_b == 1) {
                      uv_walk(uVar2,close_walk_cb,0);
                      uv_run(uVar2,0);
                      eval_a = 0;
                      iVar1 = uv_loop_close(uVar2);
                      eval_b = (int64_t)iVar1;
                      if (eval_b == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar4 = "uv_loop_close(loop)";
                      pcVar3 = "0";
                      uVar2 = 0xca;
                    }
                    else {
                      pcVar4 = "helper_timer_cb_calls";
                      pcVar3 = "1";
                      uVar2 = 199;
                    }
                    goto LAB_0016a676;
                  }
                  pcVar4 = "check_cb_calls[2]";
                }
                else {
                  pcVar4 = "check_cb_calls[0]";
                }
                eval_a = 1;
                pcVar3 = "1";
                uVar2 = 0xc4;
                goto LAB_0016a676;
              }
              pcVar4 = "prepare_cb_calls[2]";
            }
            else {
              pcVar4 = "prepare_cb_calls[0]";
            }
            eval_a = 1;
            pcVar3 = "1";
            uVar2 = 0xc3;
            goto LAB_0016a676;
          }
          pcVar4 = "idle_cb_calls[2]";
        }
        else {
          pcVar4 = "idle_cb_calls[0]";
        }
        eval_a = 1;
        pcVar3 = "1";
        uVar2 = 0xc2;
      }
      else {
        pcVar4 = "r";
        pcVar3 = "1";
        uVar2 = 0xc0;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xbc;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0xb9;
  }
LAB_0016a676:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(queue_foreach_delete) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  INIT_AND_START(idle,    loop);
  INIT_AND_START(prepare, loop);
  INIT_AND_START(check,   loop);

#ifdef __linux__
  init_and_start_fs_events(loop);

  /* helper timer to trigger async and fs_event callbacks */
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, helper_timer_cb, 0, 0);
  ASSERT_OK(r);
#endif

  r = uv_run(loop, UV_RUN_NOWAIT);
  ASSERT_EQ(1, r);

  END_ASSERTS(idle);
  END_ASSERTS(prepare);
  END_ASSERTS(check);

#ifdef __linux__
  ASSERT_EQ(1, helper_timer_cb_calls);
#endif

  MAKE_VALGRIND_HAPPY(loop);

  return 0;
}